

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O1

void check_lcps(uchar *latest,uchar *from0,lcp_t lcp0,uchar *from1,lcp_t lcp1)

{
  bool bVar1;
  long lVar2;
  uchar *puVar3;
  size_t i;
  lcp_t lVar4;
  lcp_t in_R10;
  
  lVar2 = 0;
  lVar4 = 0;
  do {
    if ((latest[lVar2] == '\0') || (latest[lVar2] != from0[lVar2])) {
      bVar1 = false;
      in_R10 = lVar4;
    }
    else {
      lVar4 = lVar4 + 1;
      bVar1 = true;
    }
    lVar2 = lVar2 + 1;
  } while (bVar1);
  if (in_R10 != lcp0) {
    __assert_fail("lcp(latest, from0) == lcp0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x629,
                  "void check_lcps(unsigned char *, unsigned char *, lcp_t, unsigned char *, lcp_t)"
                 );
  }
  lVar2 = 0;
  puVar3 = (uchar *)0x0;
  do {
    if ((latest[lVar2] == '\0') || (latest[lVar2] != from1[lVar2])) {
      bVar1 = false;
      from0 = puVar3;
    }
    else {
      puVar3 = puVar3 + 1;
      bVar1 = true;
    }
    lVar2 = lVar2 + 1;
  } while (bVar1);
  if (from0 == (uchar *)lcp1) {
    return;
  }
  __assert_fail("lcp(latest, from1) == lcp1",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                ,0x62a,
                "void check_lcps(unsigned char *, unsigned char *, lcp_t, unsigned char *, lcp_t)");
}

Assistant:

static void
check_lcps(unsigned char* latest,
           unsigned char* from0, lcp_t lcp0,
           unsigned char* from1, lcp_t lcp1)
{
	debug()<<"******** CHECK ********\n"
	       <<"Latest: '"<<latest<<"'\n"
	       <<"     0: '"<<from0<<"', lcp="<<lcp0<<"\n"
	       <<"     1: '"<<from1<<"', lcp="<<lcp1<<"\n"
	       <<"***********************\n";
	assert(lcp(latest, from0) == lcp0);
	assert(lcp(latest, from1) == lcp1);
}